

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
embree::TutorialBuildBenchmark::registerBenchmark
          (TutorialBuildBenchmark *this,string *name,int argc,char **argv)

{
  string sStack_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  registerBuildBenchmark(this,&local_48,UPDATE_DYNAMIC_DEFORMABLE,argc,argv);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  registerBuildBenchmark(this,&local_68,UPDATE_DYNAMIC_DYNAMIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,(string *)name);
  registerBuildBenchmark(this,&local_88,UPDATE_DYNAMIC_STATIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,(string *)name);
  registerBuildBenchmark(this,&local_a8,CREATE_DYNAMIC_DEFORMABLE,argc,argv);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)name);
  registerBuildBenchmark(this,&local_c8,CREATE_DYNAMIC_DYNAMIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_e8,(string *)name);
  registerBuildBenchmark(this,&local_e8,CREATE_DYNAMIC_STATIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_108,(string *)name);
  registerBuildBenchmark(this,&local_108,CREATE_STATIC_STATIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,(string *)name);
  registerBuildBenchmark(this,&local_128,CREATE_HIGH_QUALITY_STATIC_STATIC,argc,argv);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&sStack_148,(string *)name);
  registerBuildBenchmark(this,&sStack_148,CREATE_USER_THREADS_STATIC_STATIC,argc,argv);
  std::__cxx11::string::~string((string *)&sStack_148);
  return;
}

Assistant:

void TutorialBuildBenchmark::registerBenchmark(std::string const& name, int argc, char** argv)
{
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_DEFORMABLE,         argc, argv);
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_DYNAMIC,            argc, argv);
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_STATIC,             argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_DEFORMABLE,         argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_DYNAMIC,            argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_STATIC,             argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_STATIC_STATIC,              argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_HIGH_QUALITY_STATIC_STATIC, argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_USER_THREADS_STATIC_STATIC, argc, argv);
}